

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
ActionUnserialize::
SerReadWriteMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr&,Wrapper<CustomUintFormatter<2,true>,unsigned_short&>>
          (ActionUnserialize *this,
          ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s,
          CNetAddr *args,Wrapper<CustomUintFormatter<2,_true>,_unsigned_short_&> *args_1)

{
  ushort *puVar1;
  long in_FS_OFFSET;
  uint64_t raw;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::
  Unserialize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
            ((CNetAddr *)s,
             (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *
             )this);
  puVar1 = (ushort *)(args->m_addr)._union.indirect_contents.indirect;
  local_28 = 0;
  DataStream::read(*(DataStream **)(*(long *)(this + 8) + 8),(int)&local_28 + 6,(void *)0x2,
                   (size_t)args_1);
  *puVar1 = (ushort)(byte)((ulong)local_28 >> 0x38) | (ushort)((ulong)local_28 >> 0x28) & 0xff00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }